

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

json * __thiscall argo::json::operator[](json *this,size_t index)

{
  size_type sVar1;
  const_reference this_00;
  type pjVar2;
  json_array_index_range_exception *this_01;
  json_exception *this_02;
  char *json_type_name;
  size_t index_local;
  json *this_local;
  
  if (this->m_type != array_e) {
    this_02 = (json_exception *)__cxa_allocate_exception(0xd8);
    json_type_name = get_instance_type_name(this);
    json_exception::json_exception(this_02,not_an_array_e,json_type_name);
    __cxa_throw(this_02,&json_exception::typeinfo,json_exception::~json_exception);
  }
  sVar1 = std::
          vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
          ::size((vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                  *)&(this->m_value).u_object);
  if (index < sVar1) {
    this_00 = std::
              vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
              ::operator[]((vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
                            *)&(this->m_value).u_object,index);
    pjVar2 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::operator*(this_00);
    return pjVar2;
  }
  this_01 = (json_array_index_range_exception *)__cxa_allocate_exception(0xd8);
  json_array_index_range_exception::json_array_index_range_exception
            (this_01,array_index_range_e,index);
  __cxa_throw(this_01,&json_array_index_range_exception::typeinfo,
              json_array_index_range_exception::~json_array_index_range_exception);
}

Assistant:

const json &json::operator[](size_t index) const
{
    if (m_type == array_e)
    {
        if (index < m_value.u_array.size())
        {
            return *(m_value.u_array)[index];
        }
        else
        {
            throw json_array_index_range_exception(json_exception::array_index_range_e, index);
        }
    }
    else
    {
        throw json_exception(json_exception::not_an_array_e, get_instance_type_name());
    }
}